

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__get_subr(stbtt__buf idx,int n)

{
  stbtt__buf b;
  int iVar1;
  int in_EDX;
  undefined8 in_RDI;
  stbtt__buf sVar2;
  int bias;
  int count;
  int i;
  undefined1 local_10 [16];
  
  iVar1 = stbtt__cff_index_count((stbtt__buf *)0x16735c);
  i = 0x6b;
  if (iVar1 < 0x846c) {
    if (0x4d7 < iVar1) {
      i = 0x46b;
    }
  }
  else {
    i = 0x8000;
  }
  in_EDX = i + in_EDX;
  if ((in_EDX < 0) || (iVar1 <= in_EDX)) {
    local_10 = (undefined1  [16])stbtt__new_buf((void *)0x0,0);
  }
  else {
    b.data._4_4_ = in_EDX;
    b.data._0_4_ = iVar1;
    b.cursor = (int)in_RDI;
    b.size = (int)((ulong)in_RDI >> 0x20);
    local_10 = (undefined1  [16])stbtt__cff_index_get(b,i);
  }
  sVar2.data = (uchar *)local_10._0_8_;
  sVar2.cursor = local_10._8_4_;
  sVar2.size = local_10._12_4_;
  return sVar2;
}

Assistant:

static stbtt__buf stbtt__get_subr(stbtt__buf idx, int n)
{
   int count = stbtt__cff_index_count(&idx);
   int bias = 107;
   if (count >= 33900)
      bias = 32768;
   else if (count >= 1240)
      bias = 1131;
   n += bias;
   if (n < 0 || n >= count)
      return stbtt__new_buf(NULL, 0);
   return stbtt__cff_index_get(idx, n);
}